

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O0

void set_ksl_wave_fb(YM2413 *chip,int chan,int v)

{
  UINT8 local_2c;
  OPLL_SLOT *SLOT;
  OPLL_CH *CH;
  int v_local;
  int chan_local;
  YM2413 *chip_local;
  
  chip->P_CH[chan].SLOT[0].wavetable = ((int)(v & 8U) >> 3) << 10;
  if ((v & 7U) == 0) {
    local_2c = '\0';
  }
  else {
    local_2c = ((byte)v & 7) + 8;
  }
  chip->P_CH[chan].SLOT[0].fb_shift = local_2c;
  chip->P_CH[chan].SLOT[1].ksl = (UINT8)ksl_shift[v >> 6];
  chip->P_CH[chan].SLOT[1].TLL =
       chip->P_CH[chan].SLOT[1].TL +
       (chip->P_CH[chan].ksl_base >> (chip->P_CH[chan].SLOT[1].ksl & 0x1f));
  chip->P_CH[chan].SLOT[1].wavetable = ((int)(v & 0x10U) >> 4) << 10;
  return;
}

Assistant:

INLINE void set_ksl_wave_fb(YM2413 *chip,int chan,int v)
{
	OPLL_CH   *CH   = &chip->P_CH[chan];
/* modulator */
	OPLL_SLOT *SLOT = &CH->SLOT[SLOT1];
	SLOT->wavetable = ((v&0x08)>>3)*SIN_LEN;
	SLOT->fb_shift  = (v&7) ? (v&7) + 8 : 0;

/*carrier*/
	SLOT = &CH->SLOT[SLOT2];

	SLOT->ksl = ksl_shift[v >> 6];
	SLOT->TLL = SLOT->TL + (CH->ksl_base>>SLOT->ksl);

	SLOT->wavetable = ((v&0x10)>>4)*SIN_LEN;
}